

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O0

void multiplexed_client_do_work(TRANSPORT_HANDLE_DATA *transportData)

{
  LOCK_RESULT LVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_CORE_HANDLE *ppIVar3;
  undefined8 *puVar4;
  LOGGER_LOG l_1;
  IOTHUB_CLIENT_CORE_HANDLE *clientHandle;
  size_t iterator;
  size_t numberOfClients;
  LOGGER_LOG l;
  TRANSPORT_HANDLE_DATA *transportData_local;
  
  LVar1 = Lock(transportData->clientsLockHandle);
  if (LVar1 == LOCK_OK) {
    ppIVar3 = (IOTHUB_CLIENT_CORE_HANDLE *)VECTOR_size(transportData->clients);
    for (clientHandle = (IOTHUB_CLIENT_CORE_HANDLE *)0x0; clientHandle < ppIVar3;
        clientHandle = (IOTHUB_CLIENT_CORE_HANDLE *)((long)clientHandle + 1)) {
      puVar4 = (undefined8 *)VECTOR_element(transportData->clients,(size_t)clientHandle);
      if (puVar4 != (undefined8 *)0x0) {
        (*transportData->clientDoWork)((void *)*puVar4);
      }
    }
    LVar1 = Unlock(transportData->clientsLockHandle);
    if ((LVar1 != LOCK_OK) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"multiplexed_client_do_work",0xa1,1,
                "failed to unlock on multiplexed_client_do_work");
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport.c"
                ,"multiplexed_client_do_work",0x8d,1,"failed to lock for multiplexed_client_do_work"
               );
    }
  }
  return;
}

Assistant:

static void multiplexed_client_do_work(TRANSPORT_HANDLE_DATA* transportData)
{
    if (Lock(transportData->clientsLockHandle) != LOCK_OK)
    {
        LogError("failed to lock for multiplexed_client_do_work");
    }
    else
    {
        size_t numberOfClients;
        size_t iterator;

        numberOfClients = VECTOR_size(transportData->clients);
        for (iterator = 0; iterator < numberOfClients; iterator++)
        {
            IOTHUB_CLIENT_CORE_HANDLE* clientHandle = (IOTHUB_CLIENT_CORE_HANDLE*)VECTOR_element(transportData->clients, iterator);

            if (clientHandle != NULL)
            {
                transportData->clientDoWork(*clientHandle);
            }
        }

        if (Unlock(transportData->clientsLockHandle) != LOCK_OK)
        {
            LogError("failed to unlock on multiplexed_client_do_work");
        }
    }
}